

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsCreateContext(JsRuntimeHandle runtimeHandle,JsContextRef *newContext)

{
  long lVar1;
  code *pcVar2;
  bool activelyRecording;
  bool bVar3;
  JsErrorCode JVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  bool inReplayMode;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (newContext == (JsContextRef *)0x0) {
    JVar4 = JsErrorNullArgument;
    goto LAB_0036a41f;
  }
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar4 = JsErrorInvalidArgument;
    goto LAB_0036a41f;
  }
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  lVar1 = *runtimeHandle;
  if (*(long *)(lVar1 + 0x16b8) == 0) {
LAB_0036a38e:
    inReplayMode = false;
    activelyRecording = false;
    bVar3 = false;
  }
  else {
    pSVar5 = TTD::ThreadContextTTD::GetActiveScriptContext(*(ThreadContextTTD **)(lVar1 + 0x16a8));
    if (pSVar5 == (ScriptContext *)0x0) goto LAB_0036a38e;
    pSVar5 = TTD::ThreadContextTTD::GetActiveScriptContext(*(ThreadContextTTD **)(lVar1 + 0x16a8));
    bVar3 = pSVar5->TTDRecordModeEnabled;
    inReplayMode = pSVar5->TTDReplayModeEnabled;
    activelyRecording = pSVar5->TTDShouldPerformRecordAction;
  }
  JVar4 = CreateContextCore(runtimeHandle,(TTDRecorder *)auStack_38,bVar3,activelyRecording,
                            inReplayMode,newContext);
  if ((JVar4 - JsErrorNoCurrentContext < 7) &&
     ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_0036a41f:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  if (auStack_38 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_38 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_38 + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsCreateContext(_In_ JsRuntimeHandle runtimeHandle, _Out_ JsContextRef *newContext)
{
    return GlobalAPIWrapper([&](TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PARAM_NOT_NULL(newContext);
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        bool inRecord = false;
        bool activelyRecording = false;
        bool inReplay = false;

#if ENABLE_TTD
        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();
        if(threadContext->IsRuntimeInTTDMode() && threadContext->TTDContext->GetActiveScriptContext() != nullptr)
        {
            Js::ScriptContext* currentCtx = threadContext->TTDContext->GetActiveScriptContext();
            inRecord = currentCtx->IsTTDRecordModeEnabled();
            activelyRecording = currentCtx->ShouldPerformRecordAction();
            inReplay = currentCtx->IsTTDReplayModeEnabled();
        }
#endif

        return CreateContextCore(runtimeHandle, _actionEntryPopper, inRecord, activelyRecording, inReplay, newContext);
    });
}